

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

void __thiscall
testing::Matcher<const_std::pair<int,_int>_&>::Matcher
          (Matcher<const_std::pair<int,_int>_&> *this,pair<int,_int> *value)

{
  MatcherBase<const_std::pair<int,_int>_&> local_28;
  
  (this->super_MatcherBase<const_std::pair<int,_int>_&>).vtable_ = (VTable *)0x0;
  (this->super_MatcherBase<const_std::pair<int,_int>_&>).buffer_.ptr = (void *)0x0;
  (this->super_MatcherBase<const_std::pair<int,_int>_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_0032c0c8;
  local_28.buffer_ = *(Buffer *)value;
  local_28.vtable_ =
       (VTable *)
       internal::MatcherBase<std::pair<int,int>const&>::
       GetVTable<testing::internal::MatcherBase<std::pair<int,int>const&>::ValuePolicy<testing::internal::EqMatcher<std::pair<int,int>>,true>>()
       ::kVTable;
  local_28.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032c0c8;
  internal::MatcherBase<const_std::pair<int,_int>_&>::operator=
            (&this->super_MatcherBase<const_std::pair<int,_int>_&>,&local_28);
  internal::MatcherBase<const_std::pair<int,_int>_&>::~MatcherBase(&local_28);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}